

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O3

void PoolCleanup(MemoryPool *pool)

{
  ulong uVar1;
  Page *base;
  
  CleanupSweepables(pool);
  base = pool->pages;
  while (base != (Page *)0x0) {
    for (uVar1 = *(ulong *)*base; (uVar1 & 0x20) == 0;
        uVar1 = *(ulong *)(uVar1 & 0xffffffffffffff00)) {
    }
    SysPageFree(base);
    base = (Page *)(uVar1 & 0xffffffffffffff00);
  }
  return;
}

Assistant:

void
PoolCleanup(
    MemoryPool *pool)   /*!< Pool to cleanup. */
{
    Page *base, *next, *page;

    /*
     * Cleanup sweepable custom ropes (those with a freeProc).
     */

    CleanupSweepables(pool);

    /*
     * Free all system pages.
     */

    for (base = pool->pages; base; base = next) {
        for (page = base; !PAGE_FLAG(page, PAGE_FLAG_LAST);
                page = PAGE_NEXT(page));
        next = PAGE_NEXT(page);
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        SysPageFree(base);
    }
}